

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

void __thiscall
ot::commissioner::CommissionerImpl::Resign(CommissionerImpl *this,ErrorHandler *aHandler)

{
  int iVar1;
  Timer *pTVar2;
  undefined1 local_38 [8];
  _Alloc_hider local_30;
  size_type local_28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_20;
  
  pTVar2 = (Timer *)aHandler;
  iVar1 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
  if ((char)iVar1 != '\0') {
    SendKeepAlive(this,pTVar2,false);
  }
  if ((this->mKeepAliveTimer).mEnabled == true) {
    Timer::Stop(&this->mKeepAliveTimer);
  }
  (*(this->super_Commissioner)._vptr_Commissioner[6])(this);
  local_38._0_4_ = kNone;
  local_30._M_p = (pointer)&local_20;
  local_28 = 0;
  local_20._M_local_buf[0] = '\0';
  std::function<void_(ot::commissioner::Error)>::operator()(aHandler,(Error *)local_38);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void CommissionerImpl::Resign(ErrorHandler aHandler)
{
    if (IsActive())
    {
        SendKeepAlive(mKeepAliveTimer, false);
    }

    if (mKeepAliveTimer.IsRunning())
    {
        mKeepAliveTimer.Stop();
    }

    Disconnect();

    aHandler(ERROR_NONE);
}